

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_timer.cpp
# Opt level: O3

void test_repeated_func(time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        t1,int num)

{
  longlong lVar1;
  long lVar2;
  Logger *pLVar3;
  id local_28;
  
  if (test_repeated_func(std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<long,long>>>,int)
      ::cnt == '\0') {
    test_repeated_func();
  }
  local_28._M_thread = pthread_self();
  lVar1 = tid_to_ll(&local_28);
  lVar2 = std::chrono::_V2::steady_clock::now();
  pLVar3 = Logger::get_instance();
  if ((pLVar3->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","test_repeated_func",0x11);
  }
  if (1 < (int)g_log_level) {
    pLVar3 = Logger::get_instance();
    test_repeated_func::cnt = test_repeated_func::cnt - 1;
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/timer/tests/test_timer.cpp"
                      ,"test_repeated_func",0x11,LOG_LEVEL_INFO,
                      "[tid:%lld] hello, repeated_func! total repeated_cnt = %d, left cnt: %d, time diff is %d ms\n"
                      ,lVar1,num,(ulong)(uint)test_repeated_func::cnt,
                      (ulong)(uint)(int)((double)(lVar2 - (long)t1.__d.__r) / 1000000.0));
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  return;
}

Assistant:

void test_repeated_func(chrono::time_point<chrono::steady_clock> t1, int num)
{
    static int cnt = num;
    long long tid = tid_to_ll(this_thread::get_id());

    auto t2 = chrono::steady_clock::now();
    int tm_diff = static_cast<int>( chrono::duration<double, milli>(t2-t1).count() );
    LOG_INFO("[tid:%lld] hello, repeated_func! total repeated_cnt = %d, left cnt: %d, time diff is %d ms\n",
                                                                     tid, num, --cnt, tm_diff);    
}